

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O0

Bool prvTidyFindTag(TidyDocImpl *doc,Node *node)

{
  Bool BVar1;
  Dict *pDVar2;
  TidyOptionImpl *opt_00;
  TidyOptionImpl *opt;
  Dict *np;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  if ((int)(doc->config).value[0x66].v == 0) {
    if ((node->element != (tmbstr)0x0) &&
       (pDVar2 = tagsLookup(doc,&doc->tags,node->element), pDVar2 != (Dict *)0x0)) {
      node->tag = pDVar2;
      return yes;
    }
    BVar1 = prvTidynodeIsAutonomousCustomTag(doc,node);
    if (BVar1 == no) {
      doc_local._4_4_ = no;
    }
    else {
      opt_00 = prvTidygetOption(TidyCustomTags);
      prvTidyDeclareUserTag(doc,opt_00,node->element);
      pDVar2 = tagsLookup(doc,&doc->tags,node->element);
      node->tag = pDVar2;
      prvTidyReport(doc,node,node,0x232);
      doc_local._4_4_ = yes;
    }
  }
  else {
    node->tag = (doc->tags).xml_tags;
    doc_local._4_4_ = yes;
  }
  return doc_local._4_4_;
}

Assistant:

Bool TY_(FindTag)( TidyDocImpl* doc, Node *node )
{
    const Dict *np = NULL;

    if ( cfgBool(doc, TidyXmlTags) )
    {
        node->tag = doc->tags.xml_tags;
        return yes;
    }

    if ( node->element && (np = tagsLookup(doc, &doc->tags, node->element)) )
    {
        node->tag = np;
        return yes;
    }
    
    /* Add autonomous custom tag. This can be done in both HTML5 mode and
       earlier, although if it's earlier we will complain about it elsewhere. */
    if ( TY_(nodeIsAutonomousCustomTag)( doc, node) )
    {
        const TidyOptionImpl* opt = TY_(getOption)( TidyCustomTags );

        TY_(DeclareUserTag)( doc, opt, node->element );
        node->tag = tagsLookup(doc, &doc->tags, node->element);

        /* Output a message the first time we encounter an autonomous custom 
           tag. This applies despite the HTML5 mode. */
        TY_(Report)(doc, node, node, CUSTOM_TAG_DETECTED);

        return yes;
    }
    
    return no;
}